

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_parse_client_psk_identity(mbedtls_ssl_context *ssl,uchar **p,uchar *end)

{
  ushort *puVar1;
  mbedtls_ssl_config *pmVar2;
  uchar diff;
  byte bVar3;
  int iVar4;
  ushort uVar5;
  uchar *A;
  ulong uVar6;
  ulong len;
  
  pmVar2 = ssl->conf;
  if ((pmVar2->f_psk == (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) &&
     ((((pmVar2->psk == (uchar *)0x0 || (pmVar2->psk_identity == (uchar *)0x0)) ||
       (pmVar2->psk_identity_len == 0)) || (pmVar2->psk_len == 0)))) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xbfb,"got no pre-shared key");
    return -0x7600;
  }
  puVar1 = (ushort *)((long)*p + 2);
  if (end < puVar1) {
    iVar4 = 0xc04;
  }
  else {
    uVar5 = *(ushort *)*p;
    uVar5 = uVar5 << 8 | uVar5 >> 8;
    len = (ulong)uVar5;
    *p = (uchar *)puVar1;
    if ((uchar *)((long)puVar1 + len) <= end && uVar5 != 0) {
      pmVar2 = ssl->conf;
      if (pmVar2->f_psk == (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) {
        if (len == pmVar2->psk_identity_len) {
          bVar3 = 0;
          uVar6 = 0;
          do {
            bVar3 = bVar3 | *(byte *)((long)puVar1 + uVar6) ^ pmVar2->psk_identity[uVar6];
            uVar6 = uVar6 + 1;
          } while (len != uVar6);
          if (bVar3 == 0) goto LAB_0016868e;
        }
      }
      else {
        iVar4 = (*pmVar2->f_psk)(pmVar2->p_psk,ssl,(uchar *)puVar1,len);
        if (iVar4 == 0) {
LAB_0016868e:
          *p = *p + len;
          return 0;
        }
      }
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xc23,"Unknown PSK identity",*p,len);
      iVar4 = mbedtls_ssl_send_alert_message(ssl,'\x02','s');
      if (iVar4 == 0) {
        return -0x6c80;
      }
      return iVar4;
    }
    iVar4 = 0xc0d;
  }
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,iVar4,"bad client key exchange message");
  return -0x7c00;
}

Assistant:

static int ssl_parse_client_psk_identity( mbedtls_ssl_context *ssl, unsigned char **p,
                                          const unsigned char *end )
{
    int ret = 0;
    size_t n;

    if( ssl->conf->f_psk == NULL &&
        ( ssl->conf->psk == NULL || ssl->conf->psk_identity == NULL ||
          ssl->conf->psk_identity_len == 0 || ssl->conf->psk_len == 0 ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no pre-shared key" ) );
        return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
    }

    /*
     * Receive client pre-shared key identity name
     */
    if( *p + 2 > end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    n = ( (*p)[0] << 8 ) | (*p)[1];
    *p += 2;

    if( n < 1 || n > 65535 || *p + n > end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    if( ssl->conf->f_psk != NULL )
    {
        if( ssl->conf->f_psk( ssl->conf->p_psk, ssl, *p, n ) != 0 )
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
    }
    else
    {
        /* Identity is not a big secret since clients send it in the clear,
         * but treat it carefully anyway, just in case */
        if( n != ssl->conf->psk_identity_len ||
            mbedtls_ssl_safer_memcmp( ssl->conf->psk_identity, *p, n ) != 0 )
        {
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
        }
    }

    if( ret == MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY )
    {
        MBEDTLS_SSL_DEBUG_BUF( 3, "Unknown PSK identity", *p, n );
        if( ( ret = mbedtls_ssl_send_alert_message( ssl,
                              MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                              MBEDTLS_SSL_ALERT_MSG_UNKNOWN_PSK_IDENTITY ) ) != 0 )
        {
            return( ret );
        }

        return( MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY );
    }

    *p += n;

    return( 0 );
}